

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O1

void VP8LPutBitsInternal(VP8LBitWriter *bw,uint32_t bits,int n_bits)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  vp8l_atype_t vVar5;
  
  if (0 < n_bits) {
    vVar5 = bw->bits;
    iVar3 = bw->used;
    iVar4 = iVar3;
    if (0x1f < iVar3) {
      do {
        if ((bw->end < bw->cur + 4) &&
           (iVar3 = VP8LBitWriterResize(bw,(size_t)(bw->end + (0x8000 - (long)bw->buf))), iVar3 == 0
           )) {
          bw->cur = bw->buf;
          bw->error = 1;
          return;
        }
        puVar1 = bw->cur;
        *(int *)puVar1 = (int)vVar5;
        bw->cur = puVar1 + 4;
        vVar5 = vVar5 >> 0x20;
        iVar3 = iVar4 + -0x20;
        bVar2 = 0x3f < iVar4;
        iVar4 = iVar3;
      } while (bVar2);
    }
    bw->bits = (ulong)bits << ((byte)iVar3 & 0x3f) | vVar5;
    bw->used = n_bits + iVar3;
  }
  return;
}

Assistant:

void VP8LPutBitsInternal(VP8LBitWriter* const bw, uint32_t bits, int n_bits) {
  assert(n_bits <= 32);
  // That's the max we can handle:
  assert(sizeof(vp8l_wtype_t) == 2);
  if (n_bits > 0) {
    vp8l_atype_t lbits = bw->bits;
    int used = bw->used;
    // Special case of overflow handling for 32bit accumulator (2-steps flush).
#if VP8L_WRITER_BITS == 16
    if (used + n_bits >= VP8L_WRITER_MAX_BITS) {
      // Fill up all the VP8L_WRITER_MAX_BITS so it can be flushed out below.
      const int shift = VP8L_WRITER_MAX_BITS - used;
      lbits |= (vp8l_atype_t)bits << used;
      used = VP8L_WRITER_MAX_BITS;
      n_bits -= shift;
      bits >>= shift;
      assert(n_bits <= VP8L_WRITER_MAX_BITS);
    }
#endif
    // If needed, make some room by flushing some bits out.
    while (used >= VP8L_WRITER_BITS) {
      if (bw->cur + VP8L_WRITER_BYTES > bw->end) {
        const uint64_t extra_size = (bw->end - bw->buf) + MIN_EXTRA_SIZE;
        if (!CheckSizeOverflow(extra_size) ||
            !VP8LBitWriterResize(bw, (size_t)extra_size)) {
          bw->cur = bw->buf;
          bw->error = 1;
          return;
        }
      }
      *(vp8l_wtype_t*)bw->cur = (vp8l_wtype_t)WSWAP((vp8l_wtype_t)lbits);
      bw->cur += VP8L_WRITER_BYTES;
      lbits >>= VP8L_WRITER_BITS;
      used -= VP8L_WRITER_BITS;
    }
    bw->bits = lbits | ((vp8l_atype_t)bits << used);
    bw->used = used + n_bits;
  }
}